

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O0

void rbtree_insert_fixup(RBTREE *tree,RBTREE_PATH *path)

{
  RBTREE_NODE *pRVar1;
  RBTREE_NODE *parent_00;
  long in_RSI;
  RBTREE *in_RDI;
  RBTREE_NODE *uncle;
  RBTREE_NODE *grandgrandparent;
  RBTREE_NODE *grandparent;
  RBTREE_NODE *parent;
  RBTREE_NODE *node;
  RBTREE_NODE *local_50;
  RBTREE_NODE *local_48;
  RBTREE_NODE *local_40;
  RBTREE_NODE *local_20;
  RBTREE_NODE *local_18;
  
  while( true ) {
    pRVar1 = *(RBTREE_NODE **)(in_RSI + (ulong)(*(int *)(in_RSI + 0x400) - 1) * 8);
    if (*(uint *)(in_RSI + 0x400) < 2) {
      local_40 = (RBTREE_NODE *)0x0;
    }
    else {
      local_40 = *(RBTREE_NODE **)(in_RSI + (ulong)(*(int *)(in_RSI + 0x400) - 2) * 8);
    }
    local_20 = local_40;
    if (local_40 == (RBTREE_NODE *)0x0) {
      pRVar1->lc = (RBTREE_NODE *)((ulong)pRVar1->lc & 0xfffffffffffffffe);
      in_RDI->root = pRVar1;
      return;
    }
    if (((ulong)local_40->lc & 1) != 1) {
      return;
    }
    parent_00 = *(RBTREE_NODE **)(in_RSI + (ulong)(*(int *)(in_RSI + 0x400) - 3) * 8);
    if (local_40 == (RBTREE_NODE *)((ulong)parent_00->lc & 0xfffffffffffffffe)) {
      local_48 = parent_00->r;
    }
    else {
      local_48 = (RBTREE_NODE *)((ulong)parent_00->lc & 0xfffffffffffffffe);
    }
    if ((local_48 == (RBTREE_NODE *)0x0) || (((ulong)local_48->lc & 1) != 1)) break;
    local_40->lc = (RBTREE_NODE *)((ulong)local_40->lc & 0xfffffffffffffffe);
    local_48->lc = (RBTREE_NODE *)((ulong)local_48->lc & 0xfffffffffffffffe);
    parent_00->lc = (RBTREE_NODE *)((ulong)parent_00->lc | 1);
    *(int *)(in_RSI + 0x400) = *(int *)(in_RSI + 0x400) + -2;
  }
  if (*(uint *)(in_RSI + 0x400) < 4) {
    local_50 = (RBTREE_NODE *)0x0;
  }
  else {
    local_50 = *(RBTREE_NODE **)(in_RSI + (ulong)(*(int *)(in_RSI + 0x400) - 4) * 8);
  }
  if ((((ulong)parent_00->lc & 0xfffffffffffffffe) == 0) ||
     (pRVar1 != *(RBTREE_NODE **)(((ulong)parent_00->lc & 0xfffffffffffffffe) + 8))) {
    local_18 = pRVar1;
    if ((parent_00->r != (RBTREE_NODE *)0x0) &&
       (pRVar1 == (RBTREE_NODE *)((ulong)parent_00->r->lc & 0xfffffffffffffffe))) {
      rbtree_rotate_right(in_RDI,parent_00,local_40);
      local_18 = pRVar1->r;
      local_20 = pRVar1;
    }
  }
  else {
    rbtree_rotate_left(in_RDI,parent_00,local_40);
    local_20 = pRVar1;
    local_18 = (RBTREE_NODE *)((ulong)pRVar1->lc & 0xfffffffffffffffe);
  }
  if (local_18 == (RBTREE_NODE *)((ulong)local_20->lc & 0xfffffffffffffffe)) {
    rbtree_rotate_right(in_RDI,local_50,parent_00);
  }
  else {
    rbtree_rotate_left(in_RDI,local_50,parent_00);
  }
  local_20->lc = (RBTREE_NODE *)((ulong)local_20->lc & 0xfffffffffffffffe);
  parent_00->lc = (RBTREE_NODE *)((ulong)parent_00->lc | 1);
  return;
}

Assistant:

static void
rbtree_insert_fixup(RBTREE* tree, RBTREE_PATH* path)
{
    RBTREE_NODE* node;
    RBTREE_NODE* parent;
    RBTREE_NODE* grandparent;
    RBTREE_NODE* grandgrandparent;
    RBTREE_NODE* uncle;

    /* A newly inserted node usually (except the root) starts as a red one,
     * i.e. it could introduce "a double red" problem in the tree, where both
     * the node and its parent are both red. That's prohibited by the RB-tree
     * rules. */

    while(1) {
        node = path->stack[path->n - 1];
        parent = (path->n > 1) ? path->stack[path->n - 2] : NULL;

        /* No parent: the node is a root and root should alway be black. */
        if(parent == NULL) {
            MAKE_BLACK(node);
            tree->root = node;
            break;
        }

        /* If parent is black, we could not introduce a double-red problem
         * and we are done. */
        if(IS_BLACK(parent))
            break;

        /* If we reach here, there is the double-red problem.
         * Note grandparent has to exist and be black (implied from red parent). */
        grandparent = path->stack[path->n - 3];
        uncle = (parent == LEFT(grandparent)) ? RIGHT(grandparent) : LEFT(grandparent);
        if(uncle == NULL || IS_BLACK(uncle)) {
            /* Black uncle. */
            grandgrandparent = (path->n > 3) ? path->stack[path->n - 4] : NULL;
            if(LEFT(grandparent) != NULL  &&   node == RIGHT(LEFT(grandparent))) {
                rbtree_rotate_left(tree, grandparent, parent);
                parent = node;
                node = LEFT(node);
            } else if(RIGHT(grandparent) != NULL  &&  node == LEFT(RIGHT(grandparent))) {
                rbtree_rotate_right(tree, grandparent, parent);
                parent = node;
                node = RIGHT(node);
            }
            if(node == LEFT(parent))
                rbtree_rotate_right(tree, grandgrandparent, grandparent);
            else
                rbtree_rotate_left(tree, grandgrandparent, grandparent);

            /* Note that now, after the rotations, the parent points to where
             * the grand-parent was originally in the tree hierarchy, and
             * the grandparent instead became child of it.
             *
             * We switch their colors and hence make sure the parent (upper in
             * the hierarchy) is now black, fixing the double-red problem. */
            MAKE_BLACK(parent);
            MAKE_RED(grandparent);
            break;
        }

        /* Red uncle. This allows us to make both the parent and the uncle
         * black, propagating the red up to grandparent. */
        MAKE_BLACK(parent);
        MAKE_BLACK(uncle);
        MAKE_RED(grandparent);

        /* But it means we could just move the double-red issue two levels
         * up, so we have to continue there. */
        path->n -= 2;
    }
}